

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void variance(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h,uint32_t *sse,int *sum)

{
  int iVar1;
  int diff;
  uint32_t tsse;
  int tsum;
  int j;
  int i;
  int h_local;
  int w_local;
  int b_stride_local;
  uint8_t *b_local;
  int a_stride_local;
  uint8_t *a_local;
  
  tsum = 0;
  tsse = 0;
  b_local = b;
  a_local = a;
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      iVar1 = (uint)a_local[j] - (uint)b_local[j];
      tsum = iVar1 + tsum;
      tsse = iVar1 * iVar1 + tsse;
    }
    a_local = a_local + a_stride;
    b_local = b_local + b_stride;
  }
  *sum = tsum;
  *sse = tsse;
  return;
}

Assistant:

static void variance(const uint8_t *a, int a_stride, const uint8_t *b,
                     int b_stride, int w, int h, uint32_t *sse, int *sum) {
  int i, j;
  int tsum = 0;
  uint32_t tsse = 0;

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      tsum += diff;
      tsse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}